

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O2

void __thiscall
lossless_neural_sound::expression_compiler::expression::Product::dump
          (Product *this,ostream *os,Dump_state *state)

{
  anon_class_16_2_09f3fb38 fn;
  
  Expression_node::Dump_state::write_indent(state,os);
  std::operator<<(os,"Product:\n");
  state->indent_depth = state->indent_depth + 1;
  fn.state = state;
  fn.os = os;
  Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>::
  visit_leaves<lossless_neural_sound::expression_compiler::expression::Product::dump(std::ostream&,lossless_neural_sound::expression_compiler::expression::Expression_node::Dump_state&)const::_lambda(lossless_neural_sound::expression_compiler::expression::Expression_node_const*)_1_>
            (&this->
              super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>,
             fn);
  state->indent_depth = state->indent_depth - 1;
  return;
}

Assistant:

virtual void dump(std::ostream &os, Dump_state &state) const override
    {
        state.write_indent(os);
        os << "Product:\n";
        state.indent_depth++;
        visit_leaves([&](const Expression_node *factor)
                     {
                         factor->dump(os, state);
                     });
        state.indent_depth--;
    }